

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_api.c
# Opt level: O2

MPP_RET h264d_prepare(void *decoder,MppPacket pkt,HalDecTask *task)

{
  uint uVar1;
  H264dInputCtx_t *p_Inp;
  RK_U32 RVar2;
  RK_S64 RVar3;
  size_t sVar4;
  RK_U8 *pRVar5;
  ulong uVar6;
  MPP_RET MVar7;
  bool bVar8;
  
  if ((decoder == (void *)0x0 && pkt == (MppPacket)0x0) && task == (HalDecTask *)0x0) {
    if (((byte)h264d_debug & 4) == 0) {
      return MPP_OK;
    }
    _mpp_log_l(4,"h264d_api","input empty(%d).\n",(char *)0x0,0x218);
    return MPP_OK;
  }
  p_Inp = *(H264dInputCtx_t **)((long)decoder + 0x38);
  if (p_Inp->has_get_eos != '\0') {
    mpp_packet_set_length(pkt,0);
    RVar2 = mpp_packet_get_eos(pkt);
    (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)(RVar2 & 1);
    return MPP_OK;
  }
  p_Inp->in_pkt = pkt;
  RVar3 = mpp_packet_get_pts(pkt);
  p_Inp->in_pts = RVar3;
  RVar3 = mpp_packet_get_dts(pkt);
  p_Inp->in_dts = RVar3;
  sVar4 = mpp_packet_get_length(pkt);
  p_Inp->in_length = sVar4;
  RVar2 = mpp_packet_get_eos(pkt);
  p_Inp->pkt_eos = RVar2;
  pRVar5 = (RK_U8 *)mpp_packet_get_pos(pkt);
  p_Inp->in_buf = pRVar5;
  if (p_Inp->pkt_eos != 0) {
    uVar6 = p_Inp->in_length;
    if (3 < uVar6) goto LAB_00185214;
    p_Inp->has_get_eos = '\x01';
    p_Inp->in_buf = (RK_U8 *)0x0;
    p_Inp->in_length = 0;
    mpp_packet_set_length(p_Inp->in_pkt,0);
    (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)(p_Inp->pkt_eos & 1);
  }
  uVar6 = p_Inp->in_length;
LAB_00185214:
  if (uVar6 < 0xa00001) {
    RVar2 = mpp_packet_get_flag(pkt);
    if ((RVar2 & 2) != 0) {
      if (p_Inp->in_length < 4) {
        bVar8 = false;
      }
      else {
        bVar8 = *p_Inp->in_buf == '\x01';
      }
      p_Inp->is_nalff = bVar8;
      _mpp_log_l(4,"h264d_api","is_avcC=%d\n",(char *)0x0,(ulong)bVar8);
      if (p_Inp->is_nalff != '\0') {
        parse_prepare_avcC_header(p_Inp,*(H264dCurCtx_t **)((long)decoder + 0x40));
        return MPP_OK;
      }
    }
    if (((byte)h264d_debug & 0x10) != 0) {
      _mpp_log_l(4,"h264d_api",
                 "[pkt_in_timeUs] is_avcC=%d, in_pts=%lld, pkt_eos=%d, len=%d, pkt_no=%d",
                 (char *)0x0,(ulong)p_Inp->is_nalff,p_Inp->in_pts,(ulong)p_Inp->pkt_eos,
                 p_Inp->in_length,(ulong)*(uint *)(*(long *)((long)decoder + 0x48) + 0xcf0));
    }
    if (p_Inp->is_nalff == '\0') {
      fwrite_stream_to_file(p_Inp,p_Inp->in_buf,(RK_U32)p_Inp->in_length);
      do {
        if (*(int *)(*(long *)((long)decoder + 0x78) + 0x24) == 0) {
          parse_prepare_fast(p_Inp,*(H264dCurCtx_t **)((long)decoder + 0x40));
        }
        else {
          parse_prepare(p_Inp,*(H264dCurCtx_t **)((long)decoder + 0x40));
        }
        task->valid = (uint)p_Inp->task_valid;
        sVar4 = mpp_packet_get_length(pkt);
      } while ((sVar4 != 0) && (task->valid == 0));
    }
    else {
      parse_prepare_avcC_data(p_Inp,*(H264dCurCtx_t **)((long)decoder + 0x40));
      task->valid = (uint)p_Inp->task_valid;
    }
    if (p_Inp->in_length < 4) {
      (task->flags).val = (task->flags).val & 0xfffffffffffffffe | (ulong)(p_Inp->pkt_eos & 1);
    }
    if (task->valid == 0) {
      task->input_packet = (MppPacket)0x0;
      MVar7 = MPP_OK;
      if ((p_Inp->pkt_eos != 0) && (p_Inp->in_length < 4)) {
        h264d_flush_dpb_eos((H264_DecCtx_t *)decoder);
      }
    }
    else {
      uVar1 = *(uint *)(*(long *)((long)decoder + 0x30) + 0xbbc);
      MVar7 = MPP_OK;
      memset((void *)((ulong)uVar1 + *(long *)(*(long *)((long)decoder + 0x30) + 0xbb0)),0,
             (ulong)((uVar1 + 0xf & 0xfffffff0) - uVar1));
      mpp_packet_set_data(*(MppPacket *)((long)decoder + 0x90),
                          *(void **)(*(long *)((long)decoder + 0x30) + 0xbb0));
      mpp_packet_set_length
                (*(MppPacket *)((long)decoder + 0x90),
                 (ulong)(*(int *)(*(long *)((long)decoder + 0x30) + 0xbbc) + 0xfU & 0xfffffff0));
      mpp_packet_set_size(*(MppPacket *)((long)decoder + 0x90),
                          (ulong)*(uint *)(*(long *)((long)decoder + 0x30) + 3000));
      task->input_packet = *(MppPacket *)((long)decoder + 0x90);
    }
  }
  else {
    if (((byte)h264d_debug & 1) != 0) {
      _mpp_log_l(4,"h264d_api",
                 "[pkt_in_timeUs] input error, stream too large, pts=%lld, eos=%d, len=%d, pkt_no=%d"
                 ,(char *)0x0,p_Inp->in_pts,(ulong)p_Inp->pkt_eos,uVar6,
                 (ulong)*(uint *)(*(long *)((long)decoder + 0x48) + 0xcf0));
    }
    mpp_packet_set_length(pkt,0);
    MVar7 = MPP_NOK;
  }
  return MVar7;
}

Assistant:

MPP_RET h264d_prepare(void *decoder, MppPacket pkt, HalDecTask *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    H264dInputCtx_t *p_Inp = NULL;
    H264_DecCtx_t   *p_Dec = (H264_DecCtx_t *)decoder;

    INP_CHECK(ret, !decoder && !pkt && !task);

    p_Inp = p_Dec->p_Inp;
    if (p_Inp->has_get_eos) {
        mpp_packet_set_length(pkt, 0);
        task->flags.eos = mpp_packet_get_eos(pkt);
        goto __RETURN;
    }
    p_Inp->in_pkt = pkt;
    p_Inp->in_pts = mpp_packet_get_pts(pkt);
    p_Inp->in_dts = mpp_packet_get_dts(pkt);
    p_Inp->in_length = mpp_packet_get_length(pkt);
    p_Inp->pkt_eos = mpp_packet_get_eos(pkt);
    p_Inp->in_buf = (RK_U8 *)mpp_packet_get_pos(pkt);

    if (p_Inp->pkt_eos && p_Inp->in_length < 4) {
        p_Inp->has_get_eos = 1;
        p_Inp->in_buf = NULL;
        p_Inp->in_length = 0;
        mpp_packet_set_length(p_Inp->in_pkt, 0);
        task->flags.eos = p_Inp->pkt_eos;
    }

    if (p_Inp->in_length > MAX_STREM_IN_SIZE) {
        H264D_ERR("[pkt_in_timeUs] input error, stream too large, pts=%lld, eos=%d, len=%d, pkt_no=%d",
                  p_Inp->in_pts, p_Inp->pkt_eos, p_Inp->in_length, p_Dec->p_Vid->g_framecnt);
        mpp_packet_set_length(pkt, 0);
        ret = MPP_NOK;
        goto __FAILED;
    }
    //!< avcC stream
    if (mpp_packet_get_flag(pkt) & MPP_PACKET_FLAG_EXTRA_DATA) {
        RK_U8 *pdata = p_Inp->in_buf;

        p_Inp->is_nalff = (p_Inp->in_length > 3) && (pdata[0] == 1);
        mpp_log("is_avcC=%d\n", p_Inp->is_nalff);
        if (p_Inp->is_nalff) {
            (ret = parse_prepare_avcC_header(p_Inp, p_Dec->p_Cur));
            goto __RETURN;
        }
    }
    H264D_DBG(H264D_DBG_INPUT, "[pkt_in_timeUs] is_avcC=%d, in_pts=%lld, pkt_eos=%d, len=%d, pkt_no=%d",
              p_Inp->is_nalff, p_Inp->in_pts, p_Inp->pkt_eos, p_Inp->in_length, p_Dec->p_Vid->g_framecnt);
    if (p_Inp->is_nalff) {
        (ret = parse_prepare_avcC_data(p_Inp, p_Dec->p_Cur));
        task->valid = p_Inp->task_valid;  //!< prepare valid flag
    } else  {
        fwrite_stream_to_file(p_Inp, p_Inp->in_buf, (RK_U32)p_Inp->in_length);
        do {
            if (p_Dec->cfg->base.split_parse) {
                ret = parse_prepare(p_Inp, p_Dec->p_Cur);
            } else {
                ret = parse_prepare_fast(p_Inp, p_Dec->p_Cur);
            }
            task->valid = p_Inp->task_valid;  //!< prepare valid flag
        } while (mpp_packet_get_length(pkt) && !task->valid);
    }
    if (p_Inp->in_length < 4)
        task->flags.eos = p_Inp->pkt_eos;
    if (task->valid) {
        memset(p_Dec->dxva_ctx->bitstream + p_Dec->dxva_ctx->strm_offset, 0,
               MPP_ALIGN(p_Dec->dxva_ctx->strm_offset, 16) - p_Dec->dxva_ctx->strm_offset);
        mpp_packet_set_data(p_Dec->task_pkt, p_Dec->dxva_ctx->bitstream);
        mpp_packet_set_length(p_Dec->task_pkt, MPP_ALIGN(p_Dec->dxva_ctx->strm_offset, 16));
        mpp_packet_set_size(p_Dec->task_pkt, p_Dec->dxva_ctx->max_strm_size);
        task->input_packet = p_Dec->task_pkt;
    } else {
        task->input_packet = NULL;
        /*
         * During split_parse, the empty EOS will endcode and decode the
         * last complete packet.
         * When sending EOS in split mode, dpb can not be flushed
         * before split process.
         */
        if (p_Inp->pkt_eos && p_Inp->in_length < 4)
            h264d_flush_dpb_eos(p_Dec);
    }
__RETURN:

    return ret = MPP_OK;
__FAILED:
    return ret;
}